

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::Append
          (RowGroup *this,RowGroupAppendState *state,DataChunk *chunk,idx_t append_count)

{
  idx_t iVar1;
  _Head_base<0UL,_duckdb::ColumnAppendState_*,_false> _Var2;
  ColumnData *this_00;
  reference vector;
  long lVar3;
  idx_t i;
  ulong c;
  
  lVar3 = 0;
  for (c = 0; c < (ulong)((long)(this->columns).
                                super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->columns).
                                super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); c = c + 1) {
    this_00 = GetColumn(this,c);
    iVar1 = this_00->allocation_size;
    _Var2._M_head_impl =
         (state->states).
         super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
         .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl;
    vector = vector<duckdb::Vector,_true>::get<true>(&chunk->data,c);
    ColumnData::Append(this_00,(ColumnAppendState *)((long)&(_Var2._M_head_impl)->current + lVar3),
                       vector,append_count);
    this->allocation_size = this->allocation_size + (this_00->allocation_size - iVar1);
    lVar3 = lVar3 + 0x30;
  }
  state->offset_in_row_group = state->offset_in_row_group + append_count;
  return;
}

Assistant:

void RowGroup::Append(RowGroupAppendState &state, DataChunk &chunk, idx_t append_count) {
	// append to the current row_group
	D_ASSERT(chunk.ColumnCount() == GetColumnCount());
	for (idx_t i = 0; i < GetColumnCount(); i++) {
		auto &col_data = GetColumn(i);
		auto prev_allocation_size = col_data.GetAllocationSize();
		col_data.Append(state.states[i], chunk.data[i], append_count);
		allocation_size += col_data.GetAllocationSize() - prev_allocation_size;
	}
	state.offset_in_row_group += append_count;
}